

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.cpp
# Opt level: O3

void rectangle_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Am_Value *pAVar5;
  Am_Style fs;
  Am_Style ls;
  
  pAVar5 = Am_Object::Get(self,100,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x66,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&ls,pAVar5);
  pAVar5 = Am_Object::Get(self,0x6a,0);
  Am_Style::Am_Style(&fs,pAVar5);
  (*drawonable->_vptr_Am_Drawonable[0x2c])
            (drawonable,&ls,&fs,(ulong)(uint)(iVar1 + x_offset),(ulong)(uint)(iVar2 + y_offset),
             (ulong)uVar3,(ulong)uVar4,7);
  Am_Style::~Am_Style(&fs);
  Am_Style::~Am_Style(&ls);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, rectangle_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  Am_Style fs = self.Get(Am_FILL_STYLE);
  drawonable->Draw_Rectangle(ls, fs, left, top, width, height,
                             Am_DRAW_MASK_COPY);
}